

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
ParserProbModelXML::ParseArray(ParserProbModelXML *this,xmlNodePtr node)

{
  _Rb_tree_header *p_Var1;
  iterator __position;
  vector<double,std::allocator<double>> *this_00;
  char *__s;
  size_t sVar2;
  long lVar3;
  mapped_type *ppvVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  double d;
  stringstream data;
  xmlNodePtr local_1b8;
  double local_1b0;
  double local_1a8 [2];
  long local_198;
  byte abStack_18f [7];
  byte abStack_188 [96];
  ios_base local_128 [264];
  
  p_Var1 = &(this->_m_arrayCache)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->_m_arrayCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(xmlNodePtr *)(p_Var6 + 1) < node])
  {
    if (*(xmlNodePtr *)(p_Var6 + 1) >= node) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, node < *(xmlNodePtr *)(p_Var5 + 1))
     ) {
    p_Var6 = &p_Var1->_M_header;
  }
  local_1b8 = node;
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    this_00 = (vector<double,std::allocator<double>> *)operator_new(0x18);
    *(undefined8 *)this_00 = 0;
    *(undefined8 *)(this_00 + 8) = 0;
    *(undefined8 *)(this_00 + 0x10) = 0;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    __s = (char *)xmlNodeListGetString(this->_m_doc,local_1b8->children,1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)&local_198 + (int)*(undefined8 *)(local_198 + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,__s,sVar2);
    }
    lVar3 = *(long *)((long)local_1a8[0] + -0x18);
    if ((abStack_188[lVar3] & 2) == 0) {
      do {
        abStack_18f[lVar3] = abStack_18f[lVar3] | 0x10;
        std::istream::_M_extract<double>(local_1a8);
        __position._M_current = *(double **)(this_00 + 8);
        if (__position._M_current == *(double **)(this_00 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (this_00,__position,&local_1b0);
        }
        else {
          *__position._M_current = local_1b0;
          *(double **)(this_00 + 8) = __position._M_current + 1;
        }
        lVar3 = *(long *)((long)local_1a8[0] + -0x18);
      } while ((abStack_188[lVar3] & 2) == 0);
    }
    ppvVar4 = std::
              map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
              ::operator[](&this->_m_arrayCache,&local_1b8);
    *ppvVar4 = (mapped_type)this_00;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  ppvVar4 = std::
            map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
            ::operator[](&this->_m_arrayCache,&local_1b8);
  return *ppvVar4;
}

Assistant:

const vector<double>* ParserProbModelXML::ParseArray(const xmlNodePtr node)
{
    if(_m_arrayCache.count(node) == 0)
    {
      //need to create new array
      vector<double>* p = new vector<double>();
      stringstream data;
      data << (char*) xmlNodeListGetString(GetDoc(), node->xmlChildrenNode, 1);

      double d;
      while(!data.eof())
      {
        data >> skipws >> d;
        p->push_back(d);
      }
      
      _m_arrayCache[node] = p;
    }

    return _m_arrayCache[node];
}